

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O1

double Open_JTalk_get_speed(Open_JTalk *open_jtalk,_Bool *error)

{
  double dVar1;
  
  if (error != (_Bool *)0x0) {
    *error = false;
  }
  if (open_jtalk == (Open_JTalk *)0x0) {
    dVar1 = 0.0;
    if (error != (_Bool *)0x0) {
      *error = true;
      return dVar1;
    }
  }
  else {
    dVar1 = (open_jtalk->engine).condition.speed;
  }
  return dVar1;
}

Assistant:

double Open_JTalk_get_speed(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return open_jtalk->engine.condition.speed;
}